

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O1

void av1_encode_mv(AV1_COMP *cpi,aom_writer *w,ThreadData_conflict *td,MV *mv,MV *ref,
                  nmv_context *mvctx,int usehp)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  short sVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  MvSubpelPrecision precision;
  byte bVar10;
  ushort uVar11;
  ulong uVar12;
  short sVar13;
  short sVar14;
  
  sVar1 = mv->row;
  sVar2 = mv->col;
  sVar3 = ref->row;
  sVar4 = ref->col;
  sVar14 = sVar1 - sVar3;
  sVar13 = sVar2 - sVar4;
  bVar7 = (sVar14 != 0) * '\x02' | sVar13 != 0;
  precision = -1;
  if ((cpi->common).features.cur_frame_force_integer_mv == false) {
    precision = (MvSubpelPrecision)usehp;
  }
  od_ec_encode_cdf_q15(&w->ec,(uint)bVar7,mvctx->joints_cdf,4);
  if (w->allow_update_cdf != '\0') {
    uVar8 = mvctx->joints_cdf[4];
    bVar10 = (char)(uVar8 >> 4) + 5;
    uVar12 = 0;
    do {
      uVar5 = mvctx->joints_cdf[uVar12];
      if (uVar12 < bVar7) {
        sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar10 & 0x1f));
      }
      else {
        sVar6 = -(uVar5 >> (bVar10 & 0x1f));
      }
      mvctx->joints_cdf[uVar12] = sVar6 + uVar5;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
    mvctx->joints_cdf[4] = mvctx->joints_cdf[4] + (ushort)(uVar8 < 0x20);
  }
  if (sVar1 != sVar3) {
    encode_mv_component(w,(int)sVar14,mvctx->comps,precision);
  }
  if (sVar2 != sVar4) {
    encode_mv_component(w,(int)sVar13,mvctx->comps + 1,precision);
  }
  if ((cpi->sf).mv_sf.auto_mv_step_size != 0) {
    uVar8 = mv->row;
    uVar5 = mv->col;
    uVar11 = -uVar8;
    if (0 < (short)uVar8) {
      uVar11 = uVar8;
    }
    uVar8 = -uVar5;
    if (0 < (short)uVar5) {
      uVar8 = uVar5;
    }
    if (uVar8 < uVar11) {
      uVar8 = uVar11;
    }
    uVar9 = (uint)(uVar8 >> 3);
    if ((int)(uint)(uVar8 >> 3) < td->max_mv_magnitude) {
      uVar9 = td->max_mv_magnitude;
    }
    td->max_mv_magnitude = uVar9;
  }
  return;
}

Assistant:

void av1_encode_mv(AV1_COMP *cpi, aom_writer *w, ThreadData *td, const MV *mv,
                   const MV *ref, nmv_context *mvctx, int usehp) {
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);
  // If the mv_diff is zero, then we should have used near or nearest instead.
  assert(j != MV_JOINT_ZERO);
  if (cpi->common.features.cur_frame_force_integer_mv) {
    usehp = MV_SUBPEL_NONE;
  }
  aom_write_symbol(w, j, mvctx->joints_cdf, MV_JOINTS);
  if (mv_joint_vertical(j))
    encode_mv_component(w, diff.row, &mvctx->comps[0], usehp);

  if (mv_joint_horizontal(j))
    encode_mv_component(w, diff.col, &mvctx->comps[1], usehp);

  // If auto_mv_step_size is enabled then keep track of the largest
  // motion vector component used.
  if (cpi->sf.mv_sf.auto_mv_step_size) {
    int maxv = AOMMAX(abs(mv->row), abs(mv->col)) >> 3;
    td->max_mv_magnitude = AOMMAX(maxv, td->max_mv_magnitude);
  }
}